

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

void Abc_SclLibNormalizeSurface(SC_Surface *p,float Time,float Load)

{
  int iVar1;
  Vec_Flt_t *p_00;
  float fVar2;
  int local_28;
  float Entry;
  int k;
  int i;
  Vec_Flt_t *vArray;
  float Load_local;
  float Time_local;
  SC_Surface *p_local;
  
  for (Entry = 0.0; iVar1 = Vec_FltSize(&p->vIndex0), (int)Entry < iVar1;
      Entry = (float)((int)Entry + 1)) {
    fVar2 = Vec_FltEntry(&p->vIndex0,(int)Entry);
    Vec_FltWriteEntry(&p->vIndex0,(int)Entry,Time * fVar2);
  }
  for (Entry = 0.0; iVar1 = Vec_FltSize(&p->vIndex1), (int)Entry < iVar1;
      Entry = (float)((int)Entry + 1)) {
    fVar2 = Vec_FltEntry(&p->vIndex1,(int)Entry);
    Vec_FltWriteEntry(&p->vIndex1,(int)Entry,Load * fVar2);
  }
  for (local_28 = 0; iVar1 = Vec_PtrSize(&p->vData), local_28 < iVar1; local_28 = local_28 + 1) {
    p_00 = (Vec_Flt_t *)Vec_PtrEntry(&p->vData,local_28);
    for (Entry = 0.0; iVar1 = Vec_FltSize(p_00), (int)Entry < iVar1; Entry = (float)((int)Entry + 1)
        ) {
      fVar2 = Vec_FltEntry(p_00,(int)Entry);
      Vec_FltWriteEntry(p_00,(int)Entry,Time * fVar2);
    }
  }
  return;
}

Assistant:

void Abc_SclLibNormalizeSurface( SC_Surface * p, float Time, float Load )
{
    Vec_Flt_t * vArray;
    int i, k; float Entry;
    Vec_FltForEachEntry( &p->vIndex0, Entry, i ) // slew
        Vec_FltWriteEntry( &p->vIndex0, i, Time * Entry );
    Vec_FltForEachEntry( &p->vIndex1, Entry, i ) // load
        Vec_FltWriteEntry( &p->vIndex1, i, Load * Entry );
    Vec_PtrForEachEntry( Vec_Flt_t *, &p->vData, vArray, k )
        Vec_FltForEachEntry( vArray, Entry, i ) // delay/slew
            Vec_FltWriteEntry( vArray, i, Time * Entry );
}